

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void finish_live_ranges(gen_ctx_t gen_ctx)

{
  gen_ctx_t gen_ctx_local;
  
  VARR_live_range_tdestroy(&gen_ctx->lr_ctx->var_live_ranges);
  VARR_intdestroy(&gen_ctx->lr_ctx->point_map);
  bitmap_destroy(gen_ctx->lr_ctx->live_vars);
  bitmap_destroy(gen_ctx->lr_ctx->referenced_vars);
  bitmap_destroy(gen_ctx->lr_ctx->points_with_born_vars);
  bitmap_destroy(gen_ctx->lr_ctx->points_with_dead_vars);
  bitmap_destroy(gen_ctx->lr_ctx->points_with_born_or_dead_vars);
  finish_lrs(gen_ctx);
  finish_lr_bbs(gen_ctx);
  VARR_intdestroy(&gen_ctx->lr_ctx->var_to_scan_var_map);
  VARR_MIR_reg_tdestroy(&gen_ctx->lr_ctx->scan_var_to_var_map);
  free(gen_ctx->lr_ctx);
  gen_ctx->lr_ctx = (lr_ctx *)0x0;
  return;
}

Assistant:

static void finish_live_ranges (gen_ctx_t gen_ctx) {
  VARR_DESTROY (live_range_t, var_live_ranges);
  VARR_DESTROY (int, point_map);
  bitmap_destroy (live_vars);
  bitmap_destroy (referenced_vars);
  bitmap_destroy (points_with_born_vars);
  bitmap_destroy (points_with_dead_vars);
  bitmap_destroy (points_with_born_or_dead_vars);
  finish_lrs (gen_ctx);
  finish_lr_bbs (gen_ctx);
  VARR_DESTROY (int, var_to_scan_var_map);
  VARR_DESTROY (MIR_reg_t, scan_var_to_var_map);
  free (gen_ctx->lr_ctx);
  gen_ctx->lr_ctx = NULL;
}